

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int x;
  int x_00;
  int local_78;
  int local_74;
  long local_58;
  long local_50;
  
  iVar4 = w >> 1;
  x_00 = mx + iVar4;
  gdImageSetPixel(im,x_00,my,c);
  x = mx - iVar4;
  gdImageSetPixel(im,x,my,c);
  if (0 < iVar4) {
    lVar1 = (long)iVar4;
    lVar2 = (long)(h >> 1) * (long)(h >> 1);
    lVar3 = lVar2 * lVar1;
    local_58 = lVar3 * 2;
    local_50 = 0;
    local_78 = my;
    do {
      local_74 = my;
      if (0 < lVar3) {
        local_78 = local_78 + 1;
        local_74 = my + -1;
        local_50 = local_50 + lVar1 * lVar1 * 2;
        lVar3 = lVar3 - local_50;
      }
      if (lVar3 < 1) {
        iVar4 = iVar4 + -1;
        x = x + 1;
        x_00 = x_00 + -1;
        local_58 = local_58 + lVar2 * -2;
        lVar3 = lVar3 + local_58;
      }
      gdImageSetPixel(im,x,local_78,c);
      gdImageSetPixel(im,x,local_74,c);
      gdImageSetPixel(im,x_00,local_78,c);
      gdImageSetPixel(im,x_00,local_74,c);
      my = local_74;
    } while (0 < iVar4);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageEllipse(gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;

	a=w>>1;
	b=h>>1;
	gdImageSetPixel(im,mx+a, my, c);
	gdImageSetPixel(im,mx-a, my, c);
	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		gdImageSetPixel(im,mx1, my1, c);
		gdImageSetPixel(im,mx1, my2, c);
		gdImageSetPixel(im,mx2, my1, c);
		gdImageSetPixel(im,mx2, my2, c);
	}
}